

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimingControl.h
# Opt level: O2

void __thiscall
slang::ast::EventListControl::visitExprs<netlist::VariableReferenceVisitor&>
          (EventListControl *this,VariableReferenceVisitor *visitor)

{
  pointer ppTVar1;
  size_t sVar2;
  long lVar3;
  
  ppTVar1 = (this->events)._M_ptr;
  sVar2 = (this->events)._M_extent._M_extent_value;
  for (lVar3 = 0; sVar2 << 3 != lVar3; lVar3 = lVar3 + 8) {
    TimingControl::visit<netlist::VariableReferenceVisitor>
              (*(TimingControl **)((long)ppTVar1 + lVar3),visitor);
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        for (auto ev : events)
            ev->visit(visitor);
    }